

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockContextUpdateDocking(ImGuiContext *ctx)

{
  int *piVar1;
  ImGuiWindow *pIVar2;
  ImGuiDockRequest *pIVar3;
  int iVar4;
  ImGuiDockNode *pIVar5;
  ImGuiDockRequest *__dest;
  ImGuiContext *g;
  long lVar6;
  long lVar7;
  
  if (((ctx->IO).ConfigFlags & 0x40) == 0) {
    return;
  }
  ctx->HoveredDockNode = (ImGuiDockNode *)0x0;
  pIVar2 = ctx->HoveredWindowUnderMovingWindow;
  if (pIVar2 != (ImGuiWindow *)0x0) {
    if (pIVar2->DockNodeAsHost == (ImGuiDockNode *)0x0) {
      pIVar5 = pIVar2->RootWindowDockStop->DockNode;
      if (pIVar5 == (ImGuiDockNode *)0x0) goto LAB_001288c5;
    }
    else {
      pIVar5 = DockNodeTreeFindVisibleNodeByPos(pIVar2->DockNodeAsHost,(ctx->IO).MousePos);
    }
    ctx->HoveredDockNode = pIVar5;
  }
LAB_001288c5:
  iVar4 = (ctx->DockContext).Requests.Size;
  if (0 < iVar4) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      pIVar3 = (ctx->DockContext).Requests.Data;
      if (*(int *)((long)&pIVar3->Type + lVar6) == 1) {
        DockContextProcessDock(ctx,(ImGuiDockRequest *)((long)&pIVar3->Type + lVar6));
        iVar4 = (ctx->DockContext).Requests.Size;
      }
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x40;
    } while (lVar7 < iVar4);
  }
  if ((ctx->DockContext).Requests.Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (ImGuiDockRequest *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar3 = (ctx->DockContext).Requests.Data;
    if (pIVar3 != (ImGuiDockRequest *)0x0) {
      memcpy(__dest,pIVar3,(long)(ctx->DockContext).Requests.Size << 6);
      pIVar3 = (ctx->DockContext).Requests.Data;
      if ((pIVar3 != (ImGuiDockRequest *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
    }
    (ctx->DockContext).Requests.Data = __dest;
    (ctx->DockContext).Requests.Capacity = 0;
  }
  (ctx->DockContext).Requests.Size = 0;
  iVar4 = (ctx->DockContext).Nodes.Data.Size;
  if (0 < iVar4) {
    lVar6 = 8;
    lVar7 = 0;
    do {
      pIVar5 = *(ImGuiDockNode **)((long)&((ctx->DockContext).Nodes.Data.Data)->key + lVar6);
      if (((pIVar5 != (ImGuiDockNode *)0x0) && (pIVar5->ParentNode == (ImGuiDockNode *)0x0)) &&
         ((pIVar5->LocalFlags & 0x400U) == 0)) {
        DockNodeUpdate(pIVar5);
        iVar4 = (ctx->DockContext).Nodes.Data.Size;
      }
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x10;
    } while (lVar7 < iVar4);
  }
  return;
}

Assistant:

void ImGui::DockContextUpdateDocking(ImGuiContext* ctx)
{
    ImGuiContext& g = *ctx;
    ImGuiDockContext* dc  = &ctx->DockContext;
    if (!(g.IO.ConfigFlags & ImGuiConfigFlags_DockingEnable))
        return;

    // Store hovered dock node. We could in theory use DockNodeTreeFindVisibleNodeByPos() on the root host dock node, but using ->DockNode is a good shortcut.
    g.HoveredDockNode = NULL;
    if (ImGuiWindow* hovered_window = g.HoveredWindowUnderMovingWindow)
    {
        if (hovered_window->DockNodeAsHost)
            g.HoveredDockNode = DockNodeTreeFindVisibleNodeByPos(hovered_window->DockNodeAsHost, g.IO.MousePos);
        else if (hovered_window->RootWindowDockStop->DockNode)
            g.HoveredDockNode = hovered_window->RootWindowDockStop->DockNode;
    }

    // Process Docking requests
    for (int n = 0; n < dc->Requests.Size; n++)
        if (dc->Requests[n].Type == ImGuiDockRequestType_Dock)
            DockContextProcessDock(ctx, &dc->Requests[n]);
    dc->Requests.resize(0);

    // Create windows for each automatic docking nodes
    // We can have NULL pointers when we delete nodes, but because ID are recycled this should amortize nicely (and our node count will never be very high)
    for (int n = 0; n < dc->Nodes.Data.Size; n++)
        if (ImGuiDockNode* node = (ImGuiDockNode*)dc->Nodes.Data[n].val_p)
            if (node->IsFloatingNode())
                DockNodeUpdate(node);
}